

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall
File::writeMechanismTypeSet
          (File *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *value)

{
  bool bVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  if ((this->valid == true) &&
     (bVar1 = writeULong(this,(value->_M_t)._M_impl.super__Rb_tree_header._M_node_count), bVar1)) {
    p_Var3 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((bVar1 = (_Rb_tree_header *)p_Var3 == &(value->_M_t)._M_impl.super__Rb_tree_header,
           !bVar1 && (bVar2 = writeULong(this,*(unsigned_long *)(p_Var3 + 1)), bVar2))) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool File::writeMechanismTypeSet(const std::set<CK_MECHANISM_TYPE>& value)
{
	if (!valid) return false;

	// write length
	if (!writeULong(value.size()))
	{
		return false;
	}

	// write each value
	for (std::set<CK_MECHANISM_TYPE>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		if (!writeULong(*i)) return false;
	}

	return true;
}